

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O0

void str_timestamp_ex(time_t time_data,char *buffer,int buffer_size,char *format)

{
  tm *__tp;
  char *in_RCX;
  int in_EDX;
  char *in_RSI;
  long in_FS_OFFSET;
  tm *time_info;
  int in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  char *in_stack_ffffffffffffffd0;
  time_t local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  dbg_assert_imp(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8,
                 (char *)0x168f0d);
  __tp = localtime(&local_10);
  strftime(in_RSI,(long)in_EDX,in_RCX,__tp);
  in_RSI[in_EDX + -1] = '\0';
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void str_timestamp_ex(time_t time_data, char *buffer, int buffer_size, const char *format)
{
	struct tm *time_info;
	dbg_assert(buffer_size > 0, "buffer_size invalid");
	time_info = localtime(&time_data);
	strftime(buffer, buffer_size, format, time_info);
	buffer[buffer_size-1] = 0;	/* assure null termination */
}